

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__seek_to_byte(ma_dr_flac_bs *bs,ma_uint64 offsetFromStart)

{
  ma_bool32 mVar1;
  ulong in_RSI;
  ma_dr_flac_bs *in_RDI;
  ma_uint64 bytesRemaining;
  ulong local_20;
  
  if (in_RSI < 0x80000000) {
    mVar1 = (*in_RDI->onSeek)(in_RDI->pUserData,(int)in_RSI,ma_dr_flac_seek_origin_start);
    if (mVar1 == 0) {
      return 0;
    }
  }
  else {
    mVar1 = (*in_RDI->onSeek)(in_RDI->pUserData,0x7fffffff,ma_dr_flac_seek_origin_start);
    if (mVar1 == 0) {
      return 0;
    }
    for (local_20 = in_RSI - 0x7fffffff; 0x7fffffff < local_20; local_20 = local_20 - 0x7fffffff) {
      mVar1 = (*in_RDI->onSeek)(in_RDI->pUserData,0x7fffffff,ma_dr_flac_seek_origin_current);
      if (mVar1 == 0) {
        return 0;
      }
    }
    if ((local_20 != 0) &&
       (mVar1 = (*in_RDI->onSeek)(in_RDI->pUserData,(int)local_20,ma_dr_flac_seek_origin_current),
       mVar1 == 0)) {
      return 0;
    }
  }
  ma_dr_flac__reset_cache(in_RDI);
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_byte(ma_dr_flac_bs* bs, ma_uint64 offsetFromStart)
{
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(offsetFromStart > 0);
    if (offsetFromStart > 0x7FFFFFFF) {
        ma_uint64 bytesRemaining = offsetFromStart;
        if (!bs->onSeek(bs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_start)) {
            return MA_FALSE;
        }
        bytesRemaining -= 0x7FFFFFFF;
        while (bytesRemaining > 0x7FFFFFFF) {
            if (!bs->onSeek(bs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            bytesRemaining -= 0x7FFFFFFF;
        }
        if (bytesRemaining > 0) {
            if (!bs->onSeek(bs->pUserData, (int)bytesRemaining, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
        }
    } else {
        if (!bs->onSeek(bs->pUserData, (int)offsetFromStart, ma_dr_flac_seek_origin_start)) {
            return MA_FALSE;
        }
    }
    ma_dr_flac__reset_cache(bs);
    return MA_TRUE;
}